

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_value.cpp
# Opt level: O3

void duckdb::UnionValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  Vector *pVVar2;
  reference other;
  
  pVVar2 = UnionVector::GetMember(result,0);
  other = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::Reference(pVVar2,other);
  pVVar2 = UnionVector::GetTags(result);
  Vector::SetVectorType(pVVar2,CONSTANT_VECTOR);
  *pVVar2->data = '\0';
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  Vector::Verify(result,args->count);
  return;
}

Assistant:

static void UnionValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// Assign the new entries to the result vector
	UnionVector::GetMember(result, 0).Reference(args.data[0]);

	// Set the result tag vector to a constant value
	auto &tag_vector = UnionVector::GetTags(result);
	tag_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
	ConstantVector::GetData<union_tag_t>(tag_vector)[0] = 0;

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(args.size());
}